

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

void __thiscall
CP::vector<std::pair<int,_int>_>::expand(vector<std::pair<int,_int>_> *this,size_t capacity)

{
  size_t sVar1;
  pair<int,_int> *ppVar2;
  pair<int,_int> *__s;
  size_t sVar3;
  
  __s = (pair<int,_int> *)operator_new__(-(ulong)(capacity >> 0x3d != 0) | capacity * 8);
  if (capacity != 0) {
    memset(__s,0,capacity * 8);
  }
  sVar1 = this->mSize;
  if (sVar1 != 0) {
    ppVar2 = this->mData;
    sVar3 = 0;
    do {
      __s[sVar3].first = ppVar2[sVar3].first;
      __s[sVar3].second = ppVar2[sVar3].second;
      sVar3 = sVar3 + 1;
    } while (sVar1 != sVar3);
  }
  if (this->mData != (pair<int,_int> *)0x0) {
    operator_delete__(this->mData);
  }
  this->mData = __s;
  this->mCap = capacity;
  return;
}

Assistant:

void expand(size_t capacity) {
      T *arr = new T[capacity]();
      for (size_t i = 0;i < mSize;i++) {
        arr[i] = mData[i];
      }
      delete [] mData;
      mData = arr;
      mCap = capacity;
    }